

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

string * wallet::RecurseImportData_abi_cxx11_
                   (CScript *script,ImportData *import_data,ScriptContext script_ctx)

{
  Span<const_unsigned_char> _vch;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  Span<const_unsigned_char> _vch_00;
  Span<const_unsigned_char> vch_01;
  string_view file;
  string_view msg;
  string_view func;
  bool bVar1;
  TxoutType TVar2;
  size_type sVar3;
  undefined8 uVar4;
  mapped_type_conflict4 *pmVar5;
  basic_string_view<char,_std::char_traits<char>_> *this;
  int in_ECX;
  CScript *in_RDX;
  string *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_bool>_>,_bool> pVar6;
  pair<std::_Rb_tree_const_iterator<CScript>,_bool> pVar7;
  size_t i;
  TxoutType script_type;
  type subscript_1;
  type subscript;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solverdata;
  CKeyID id_3;
  CScriptID id_2;
  CPubKey pubkey_1;
  CScriptID id_1;
  CKeyID id;
  CPubKey pubkey;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffa98;
  CScript *in_stack_fffffffffffffaa0;
  Span<const_unsigned_char> *in_stack_fffffffffffffaa8;
  CScriptID *in_stack_fffffffffffffab0;
  map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
  *in_stack_fffffffffffffab8;
  CPubKey *in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffad0;
  int line;
  string *in_stack_fffffffffffffad8;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  _Rb_tree_const_iterator<CScript> in_stack_fffffffffffffae8;
  char *in_stack_fffffffffffffaf0;
  bool *in_stack_fffffffffffffaf8;
  undefined8 in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  size_t in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  size_t in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffbc0;
  CScript *in_stack_fffffffffffffbc8;
  long local_390;
  ScriptContext in_stack_fffffffffffffc8c;
  allocator<char> local_31b;
  allocator<char> local_31a;
  allocator<char> local_319 [23];
  allocator<char> local_302;
  allocator<char> local_301 [9];
  size_t local_2f8;
  uchar *local_2f0;
  allocator<char> local_2e2;
  undefined1 local_2e1;
  allocator<char> local_2ca;
  allocator<char> local_2c9 [29];
  undefined1 local_2ac;
  allocator<char> local_2a9 [23];
  allocator<char> local_292;
  undefined1 local_291;
  _Base_ptr local_268;
  undefined1 local_260;
  _Base_ptr local_258;
  undefined1 local_250;
  _Base_ptr local_248;
  undefined1 local_240;
  _Base_ptr local_238;
  undefined1 local_230;
  _Base_ptr local_228;
  undefined1 local_220;
  _Base_ptr local_218;
  undefined1 local_210;
  uchar local_1a8 [416];
  long local_8;
  
  line = (int)((ulong)in_stack_fffffffffffffad0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(in_stack_fffffffffffffa98);
  TVar2 = Solver(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  switch(TVar2) {
  case NONSTANDARD:
  case ANCHOR:
  case WITNESS_V1_TAPROOT:
  case WITNESS_UNKNOWN:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffae8._M_node,
               (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (allocator<char> *)in_stack_fffffffffffffad8);
    std::allocator<char>::~allocator(&local_31b);
    break;
  case PUBKEY:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffaa8,(size_type)in_stack_fffffffffffffaa0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffaa8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffa98);
    _vch.m_size = (size_t)in_stack_fffffffffffffab8;
    _vch.m_data = (uchar *)in_stack_fffffffffffffab0;
    CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffaa8,_vch);
    CPubKey::GetID(in_stack_fffffffffffffac0);
    local_291 = 0;
    pVar6 = std::map<CKeyID,bool,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,bool>>>::
            emplace<CKeyID,bool>
                      (in_stack_fffffffffffffab8,(CKeyID *)in_stack_fffffffffffffab0,
                       (bool *)in_stack_fffffffffffffaa8);
    local_218 = (_Base_ptr)pVar6.first._M_node;
    local_210 = pVar6.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffae8._M_node,
               (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (allocator<char> *)in_stack_fffffffffffffad8);
    std::allocator<char>::~allocator(&local_292);
    break;
  case PUBKEYHASH:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffaa8,(size_type)in_stack_fffffffffffffaa0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffaa8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffa98);
    vch.m_size = (size_t)in_stack_fffffffffffffab8;
    vch.m_data = (uchar *)in_stack_fffffffffffffab0;
    uint160::uint160((uint160 *)in_stack_fffffffffffffa98,vch);
    CKeyID::CKeyID((CKeyID *)in_stack_fffffffffffffa98,(uint160 *)0x15e9ddc);
    pmVar5 = std::
             map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>::
             operator[]((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                         *)in_stack_fffffffffffffac0,(key_type *)in_stack_fffffffffffffab8);
    *pmVar5 = true;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffae8._M_node,
               (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (allocator<char> *)in_stack_fffffffffffffad8);
    std::allocator<char>::~allocator(local_2a9);
    break;
  case SCRIPTHASH:
    if (in_ECX == 1) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffae8._M_node,
                 (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                 (allocator<char> *)in_stack_fffffffffffffad8);
      JSONRPCError((int)((ulong)in_stack_fffffffffffffae8._M_node >> 0x20),in_stack_fffffffffffffad8
                  );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_015eae36;
    }
    if (in_ECX == 2) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffae8._M_node,
                 (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                 (allocator<char> *)in_stack_fffffffffffffad8);
      JSONRPCError((int)((ulong)in_stack_fffffffffffffae8._M_node >> 0x20),in_stack_fffffffffffffad8
                  );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_015eae36;
    }
    local_2ac = in_ECX == 0;
    inline_check_non_fatal<bool>
              (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
               (int)((ulong)in_stack_fffffffffffffae8._M_node >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (char *)in_stack_fffffffffffffad8);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffaa8,(size_type)in_stack_fffffffffffffaa0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffaa8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffa98);
    vch_00.m_size = (size_t)in_stack_fffffffffffffab8;
    vch_00.m_data = (uchar *)in_stack_fffffffffffffab0;
    uint160::uint160((uint160 *)in_stack_fffffffffffffa98,vch_00);
    CScriptID::CScriptID((CScriptID *)in_stack_fffffffffffffa98,(uint160 *)0x15ea16d);
    std::unique_ptr<CScript,_std::default_delete<CScript>_>::unique_ptr
              ((unique_ptr<CScript,_std::default_delete<CScript>_> *)in_stack_fffffffffffffa98,
               (unique_ptr<CScript,_std::default_delete<CScript>_> *)0x15ea184);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<CScript,_std::default_delete<CScript>_> *)
                       in_stack_fffffffffffffa98);
    if (bVar1) {
      std::unique_ptr<CScript,_std::default_delete<CScript>_>::operator*
                ((unique_ptr<CScript,_std::default_delete<CScript>_> *)in_stack_fffffffffffffaa8);
      CScriptID::CScriptID(in_stack_fffffffffffffab0,(CScript *)in_stack_fffffffffffffaa8);
      bVar1 = BaseHash<uint160>::operator!=
                        ((BaseHash<uint160> *)in_stack_fffffffffffffaa8,
                         (BaseHash<uint160> *)in_stack_fffffffffffffaa0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffae8._M_node,
                   (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                   (allocator<char> *)in_stack_fffffffffffffad8);
        std::allocator<char>::~allocator(&local_2ca);
      }
      else {
        std::unique_ptr<CScript,_std::default_delete<CScript>_>::operator*
                  ((unique_ptr<CScript,_std::default_delete<CScript>_> *)in_stack_fffffffffffffaa8);
        pVar7 = std::set<CScript,std::less<CScript>,std::allocator<CScript>>::emplace<CScript&>
                          ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
                           in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
        local_228 = (_Base_ptr)pVar7.first._M_node;
        local_220 = pVar7.second;
        std::unique_ptr<CScript,_std::default_delete<CScript>_>::operator*
                  ((unique_ptr<CScript,_std::default_delete<CScript>_> *)in_stack_fffffffffffffaa8);
        RecurseImportData_abi_cxx11_
                  (in_RDX,(ImportData *)CONCAT44(in_ECX,TVar2),in_stack_fffffffffffffc8c);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffae8._M_node,
                 (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                 (allocator<char> *)in_stack_fffffffffffffad8);
      std::allocator<char>::~allocator(local_2c9);
    }
    std::unique_ptr<CScript,_std::default_delete<CScript>_>::~unique_ptr
              ((unique_ptr<CScript,_std::default_delete<CScript>_> *)in_stack_fffffffffffffaa8);
    break;
  case MULTISIG:
    for (local_390 = 1;
        sVar3 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::size(in_stack_fffffffffffffa98), local_390 + 1U < sVar3; local_390 = local_390 + 1
        ) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffaa8,(size_type)in_stack_fffffffffffffaa0);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_fffffffffffffaa8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffaa0,
                 in_stack_fffffffffffffa98);
      _vch_00.m_size = (size_t)in_stack_fffffffffffffab8;
      _vch_00.m_data = (uchar *)in_stack_fffffffffffffab0;
      CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffaa8,_vch_00);
      CPubKey::GetID(in_stack_fffffffffffffac0);
      local_2e1 = 0;
      pVar6 = std::map<CKeyID,bool,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,bool>>>::
              emplace<CKeyID,bool>
                        (in_stack_fffffffffffffab8,(CKeyID *)in_stack_fffffffffffffab0,
                         (bool *)in_stack_fffffffffffffaa8);
      local_238 = (_Base_ptr)pVar6.first._M_node;
      local_230 = pVar6.second;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffae8._M_node,
               (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (allocator<char> *)in_stack_fffffffffffffad8);
    std::allocator<char>::~allocator(&local_2e2);
    break;
  case NULL_DATA:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffae8._M_node,
               (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (allocator<char> *)in_stack_fffffffffffffad8);
    std::allocator<char>::~allocator(&local_31a);
    break;
  case WITNESS_V0_SCRIPTHASH:
    if (in_ECX == 2) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffae8._M_node,
                 (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                 (allocator<char> *)in_stack_fffffffffffffad8);
      JSONRPCError((int)((ulong)in_stack_fffffffffffffae8._M_node >> 0x20),in_stack_fffffffffffffad8
                  );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_015eae36;
    }
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffaa8,(size_type)in_stack_fffffffffffffaa0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffaa8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffa98);
    RIPEMD160(local_1a8,local_2f8,local_2f0);
    CScriptID::CScriptID((CScriptID *)in_stack_fffffffffffffa98,(uint160 *)0x15ea6f2);
    std::unique_ptr<CScript,_std::default_delete<CScript>_>::unique_ptr
              ((unique_ptr<CScript,_std::default_delete<CScript>_> *)in_stack_fffffffffffffa98,
               (unique_ptr<CScript,_std::default_delete<CScript>_> *)0x15ea70d);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<CScript,_std::default_delete<CScript>_> *)
                       in_stack_fffffffffffffa98);
    if (bVar1) {
      std::unique_ptr<CScript,_std::default_delete<CScript>_>::operator*
                ((unique_ptr<CScript,_std::default_delete<CScript>_> *)in_stack_fffffffffffffaa8);
      CScriptID::CScriptID(in_stack_fffffffffffffab0,(CScript *)in_stack_fffffffffffffaa8);
      bVar1 = BaseHash<uint160>::operator!=
                        ((BaseHash<uint160> *)in_stack_fffffffffffffaa8,
                         (BaseHash<uint160> *)in_stack_fffffffffffffaa0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffae8._M_node,
                   (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                   (allocator<char> *)in_stack_fffffffffffffad8);
        std::allocator<char>::~allocator(&local_302);
      }
      else {
        if (in_ECX == 0) {
          pVar7 = std::set<CScript,std::less<CScript>,std::allocator<CScript>>::
                  emplace<CScript_const&>
                            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
                             in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
          local_248 = (_Base_ptr)pVar7.first._M_node;
          local_240 = pVar7.second;
        }
        std::unique_ptr<CScript,_std::default_delete<CScript>_>::operator*
                  ((unique_ptr<CScript,_std::default_delete<CScript>_> *)in_stack_fffffffffffffaa8);
        pVar7 = std::set<CScript,std::less<CScript>,std::allocator<CScript>>::emplace<CScript&>
                          ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
                           in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
        local_258 = (_Base_ptr)pVar7.first._M_node;
        local_250 = pVar7.second;
        std::unique_ptr<CScript,_std::default_delete<CScript>_>::operator*
                  ((unique_ptr<CScript,_std::default_delete<CScript>_> *)in_stack_fffffffffffffaa8);
        RecurseImportData_abi_cxx11_
                  (in_RDX,(ImportData *)CONCAT44(in_ECX,TVar2),in_stack_fffffffffffffc8c);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffae8._M_node,
                 (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                 (allocator<char> *)in_stack_fffffffffffffad8);
      std::allocator<char>::~allocator(local_301);
    }
    std::unique_ptr<CScript,_std::default_delete<CScript>_>::~unique_ptr
              ((unique_ptr<CScript,_std::default_delete<CScript>_> *)in_stack_fffffffffffffaa8);
    break;
  case WITNESS_V0_KEYHASH:
    if (in_ECX == 2) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffae8._M_node,
                 (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                 (allocator<char> *)in_stack_fffffffffffffad8);
      JSONRPCError((int)((ulong)in_stack_fffffffffffffae8._M_node >> 0x20),in_stack_fffffffffffffad8
                  );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_015eae36;
    }
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffaa8,(size_type)in_stack_fffffffffffffaa0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffaa8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffa98);
    vch_01.m_size = (size_t)in_stack_fffffffffffffab8;
    vch_01.m_data = (uchar *)in_stack_fffffffffffffab0;
    uint160::uint160((uint160 *)in_stack_fffffffffffffa98,vch_01);
    CKeyID::CKeyID((CKeyID *)in_stack_fffffffffffffa98,(uint160 *)0x15eab12);
    pmVar5 = std::
             map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>::
             operator[]((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                         *)in_stack_fffffffffffffac0,(key_type *)in_stack_fffffffffffffab8);
    *pmVar5 = true;
    if (in_ECX == 0) {
      pVar7 = std::set<CScript,std::less<CScript>,std::allocator<CScript>>::emplace<CScript_const&>
                        ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
                         in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      in_stack_fffffffffffffae8 = pVar7.first._M_node;
      in_stack_fffffffffffffae7 = pVar7.second;
      local_268 = in_stack_fffffffffffffae8._M_node;
      local_260 = in_stack_fffffffffffffae7;
    }
    __a = local_319;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffae8._M_node,
               (char *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),__a);
    std::allocator<char>::~allocator(local_319);
    break;
  default:
    this = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this,(char *)in_stack_fffffffffffffab0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this,(char *)in_stack_fffffffffffffab0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this,(char *)in_stack_fffffffffffffab0);
    msg._M_str = in_stack_fffffffffffffb28;
    msg._M_len = in_stack_fffffffffffffb20;
    file._M_str._0_7_ = in_stack_fffffffffffffb18;
    file._M_len = in_stack_fffffffffffffb10;
    file._M_str._7_1_ = in_stack_fffffffffffffb1f;
    func._M_str = in_stack_fffffffffffffb68;
    func._M_len = in_stack_fffffffffffffb60;
    NonFatalCheckError::NonFatalCheckError
              ((NonFatalCheckError *)in_stack_fffffffffffffad8,msg,file,line,func);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this,&NonFatalCheckError::typeinfo,NonFatalCheckError::~NonFatalCheckError);
    }
    goto LAB_015eae36;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffaa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
LAB_015eae36:
  __stack_chk_fail();
}

Assistant:

static std::string RecurseImportData(const CScript& script, ImportData& import_data, const ScriptContext script_ctx)
{
    // Use Solver to obtain script type and parsed pubkeys or hashes:
    std::vector<std::vector<unsigned char>> solverdata;
    TxoutType script_type = Solver(script, solverdata);

    switch (script_type) {
    case TxoutType::PUBKEY: {
        CPubKey pubkey(solverdata[0]);
        import_data.used_keys.emplace(pubkey.GetID(), false);
        return "";
    }
    case TxoutType::PUBKEYHASH: {
        CKeyID id = CKeyID(uint160(solverdata[0]));
        import_data.used_keys[id] = true;
        return "";
    }
    case TxoutType::SCRIPTHASH: {
        if (script_ctx == ScriptContext::P2SH) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2SH inside another P2SH");
        if (script_ctx == ScriptContext::WITNESS_V0) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2SH inside a P2WSH");
        CHECK_NONFATAL(script_ctx == ScriptContext::TOP);
        CScriptID id = CScriptID(uint160(solverdata[0]));
        auto subscript = std::move(import_data.redeemscript); // Remove redeemscript from import_data to check for superfluous script later.
        if (!subscript) return "missing redeemscript";
        if (CScriptID(*subscript) != id) return "redeemScript does not match the scriptPubKey";
        import_data.import_scripts.emplace(*subscript);
        return RecurseImportData(*subscript, import_data, ScriptContext::P2SH);
    }
    case TxoutType::MULTISIG: {
        for (size_t i = 1; i + 1< solverdata.size(); ++i) {
            CPubKey pubkey(solverdata[i]);
            import_data.used_keys.emplace(pubkey.GetID(), false);
        }
        return "";
    }
    case TxoutType::WITNESS_V0_SCRIPTHASH: {
        if (script_ctx == ScriptContext::WITNESS_V0) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2WSH inside another P2WSH");
        CScriptID id{RIPEMD160(solverdata[0])};
        auto subscript = std::move(import_data.witnessscript); // Remove redeemscript from import_data to check for superfluous script later.
        if (!subscript) return "missing witnessscript";
        if (CScriptID(*subscript) != id) return "witnessScript does not match the scriptPubKey or redeemScript";
        if (script_ctx == ScriptContext::TOP) {
            import_data.import_scripts.emplace(script); // Special rule for IsMine: native P2WSH requires the TOP script imported (see script/ismine.cpp)
        }
        import_data.import_scripts.emplace(*subscript);
        return RecurseImportData(*subscript, import_data, ScriptContext::WITNESS_V0);
    }
    case TxoutType::WITNESS_V0_KEYHASH: {
        if (script_ctx == ScriptContext::WITNESS_V0) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2WPKH inside P2WSH");
        CKeyID id = CKeyID(uint160(solverdata[0]));
        import_data.used_keys[id] = true;
        if (script_ctx == ScriptContext::TOP) {
            import_data.import_scripts.emplace(script); // Special rule for IsMine: native P2WPKH requires the TOP script imported (see script/ismine.cpp)
        }
        return "";
    }
    case TxoutType::NULL_DATA:
        return "unspendable script";
    case TxoutType::NONSTANDARD:
    case TxoutType::WITNESS_UNKNOWN:
    case TxoutType::WITNESS_V1_TAPROOT:
    case TxoutType::ANCHOR:
        return "unrecognized script";
    } // no default case, so the compiler can warn about missing cases
    NONFATAL_UNREACHABLE();
}